

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# common.h
# Opt level: O2

Maybe<kj::Array<kj::_::Tuple<kj::String,_kj::Array<unsigned_long>_>_>_> *
kj::parse::
Many_<kj::parse::Sequence_<const_kj::parse::Transform_<kj::parse::Sequence_<const_kj::parse::CharGroup__&,_kj::parse::Many_<const_kj::parse::CharGroup__&,_false>_>,_kj::parse::_::IdentifierToString>_&,_kj::parse::Many_<kj::parse::Sequence_<kj::parse::ExactlyConst_<char,_'['>,_const_kj::parse::Sequence_<kj::parse::OneOf_<kj::parse::Transform_<kj::parse::Sequence_<kj::parse::ExactlyConst_<char,_'0'>,_kj::parse::ExactlyConst_<char,_'x'>,_kj::parse::Many_<const_kj::parse::CharGroup__&,_true>_>,_kj::parse::_::ParseInteger<16U>_>,_kj::parse::Transform_<kj::parse::Sequence_<kj::parse::ExactlyConst_<char,_'0'>,_kj::parse::Many_<const_kj::parse::CharGroup__&,_false>_>,_kj::parse::_::ParseInteger<8U>_>,_kj::parse::Transform_<kj::parse::Sequence_<kj::parse::CharGroup_,_kj::parse::Many_<const_kj::parse::CharGroup__&,_false>_>,_kj::parse::_::ParseInteger<10U>_>_>,_kj::parse::NotLookingAt_<kj::parse::CharGroup_>_>_&,_kj::parse::ExactlyConst_<char,_']'>_>,_false>,_kj::parse::OneOf_<const_kj::parse::EndOfInput__&,_kj::parse::Sequence_<kj::parse::ExactlyConst_<char,_'.'>,_kj::parse::NotLookingAt_<const_kj::parse::EndOfInput__&>_>_>_>,_false>
::
Impl<kj::parse::IteratorInput<char,_const_char_*>,_kj::_::Tuple<kj::String,_kj::Array<unsigned_long>_>_>
::apply(Maybe<kj::Array<kj::_::Tuple<kj::String,_kj::Array<unsigned_long>_>_>_>
        *__return_storage_ptr__,
       Sequence_<const_kj::parse::Transform_<kj::parse::Sequence_<const_kj::parse::CharGroup__&,_kj::parse::Many_<const_kj::parse::CharGroup__&,_false>_>,_kj::parse::_::IdentifierToString>_&,_kj::parse::Many_<kj::parse::Sequence_<kj::parse::ExactlyConst_<char,__[_>,_const_kj::parse::Sequence_<kj::parse::OneOf_<kj::parse::Transform_<kj::parse::Sequence_<kj::parse::ExactlyConst_<char,__0_>,_kj::parse::ExactlyConst_<char,__x_>,_kj::parse::Many_<const_kj::parse::CharGroup__&,_true>_>,_kj::parse::_::ParseInteger<16U>_>,_kj::parse::Transform_<kj::parse::Sequence_<kj::parse::ExactlyConst_<char,__0_>,_kj::parse::Many_<const_kj::parse::CharGroup__&,_false>_>,_kj::parse::_::ParseInteger<8U>_>,_kj::parse::Transform_<kj::parse::Sequence_<kj::parse::CharGroup_,_kj::parse::Many_<const_kj::parse::CharGroup__&,_false>_>,_kj::parse::_::ParseInteger<10U>_>_>,_kj::parse::NotLookingAt_<kj::parse::CharGroup_>_>_&,_kj::parse::ExactlyConst_<char,__]_>_>,_false>,_kj::parse::OneOf_<const_kj::parse::EndOfInput__&,_kj::parse::Sequence_<kj::parse::ExactlyConst_<char,____>,_kj::parse::NotLookingAt_<const_kj::parse::EndOfInput__&>_>_>_>
       *subParser,IteratorInput<char,_const_char_*> *input)

{
  char *pcVar1;
  Maybe<kj::Array<kj::_::Tuple<kj::String,_kj::Array<unsigned_long>_>_>_> *pMVar2;
  IteratorInput<char,_const_char_*> subInput;
  NullableValue<kj::_::Tuple<kj::String,_kj::Array<unsigned_long>_>_> _subResult425;
  Results results;
  IteratorInput<char,_const_char_*> local_f0;
  Maybe<kj::Array<kj::_::Tuple<kj::String,_kj::Array<unsigned_long>_>_>_> *local_d0;
  NullableValue<kj::_::Tuple<kj::String,_kj::Array<unsigned_long>_>_> local_c8;
  ArrayBuilder<kj::_::Tuple<kj::String,_kj::Array<unsigned_long>_>_> local_88;
  NullableValue<kj::_::Tuple<kj::String,_kj::Array<unsigned_long>_>_> local_68;
  
  local_88.endPtr = (Tuple<kj::String,_kj::Array<unsigned_long>_> *)0x0;
  local_88.ptr = (Tuple<kj::String,_kj::Array<unsigned_long>_> *)0x0;
  local_88.pos = (RemoveConst<kj::_::Tuple<kj::String,_kj::Array<unsigned_long>_>_> *)0x0;
  local_88.disposer = (ArrayDisposer *)&NullArrayDisposer::instance;
  local_d0 = __return_storage_ptr__;
  do {
    pcVar1 = input->pos;
    if (pcVar1 == input->end) {
LAB_0012489f:
      Vector<kj::_::Tuple<kj::String,_kj::Array<unsigned_long>_>_>::releaseAsArray
                ((Array<kj::_::Tuple<kj::String,_kj::Array<unsigned_long>_>_> *)&local_c8,
                 (Vector<kj::_::Tuple<kj::String,_kj::Array<unsigned_long>_>_> *)&local_88);
      pMVar2 = local_d0;
      (local_d0->ptr).isSet = true;
      (local_d0->ptr).field_1.value.ptr =
           (Tuple<kj::String,_kj::Array<unsigned_long>_> *)local_c8._0_8_;
      (local_d0->ptr).field_1.value.size_ =
           (size_t)local_c8.field_1.value.impl.super_TupleElement<0U,_kj::String>.value.content.ptr;
      (local_d0->ptr).field_1.value.disposer =
           (ArrayDisposer *)
           local_c8.field_1.value.impl.super_TupleElement<0U,_kj::String>.value.content.size_;
      local_c8._0_8_ = (Tuple<kj::String,_kj::Array<unsigned_long>_> *)0x0;
      local_c8.field_1.value.impl.super_TupleElement<0U,_kj::String>.value.content.ptr = (char *)0x0
      ;
      Array<kj::_::Tuple<kj::String,_kj::Array<unsigned_long>_>_>::~Array
                ((Array<kj::_::Tuple<kj::String,_kj::Array<unsigned_long>_>_> *)&local_c8);
      ArrayBuilder<kj::_::Tuple<kj::String,_kj::Array<unsigned_long>_>_>::dispose(&local_88);
      return pMVar2;
    }
    local_f0.parent = input;
    local_f0.pos = pcVar1;
    local_f0.end = input->end;
    local_f0.best = pcVar1;
    Sequence_<const_kj::parse::Transform_<kj::parse::Sequence_<const_kj::parse::CharGroup__&,_kj::parse::Many_<const_kj::parse::CharGroup__&,_false>_>,_kj::parse::_::IdentifierToString>_&,_kj::parse::Many_<kj::parse::Sequence_<kj::parse::ExactlyConst_<char,_'['>,_const_kj::parse::Sequence_<kj::parse::OneOf_<kj::parse::Transform_<kj::parse::Sequence_<kj::parse::ExactlyConst_<char,_'0'>,_kj::parse::ExactlyConst_<char,_'x'>,_kj::parse::Many_<const_kj::parse::CharGroup__&,_true>_>,_kj::parse::_::ParseInteger<16U>_>,_kj::parse::Transform_<kj::parse::Sequence_<kj::parse::ExactlyConst_<char,_'0'>,_kj::parse::Many_<const_kj::parse::CharGroup__&,_false>_>,_kj::parse::_::ParseInteger<8U>_>,_kj::parse::Transform_<kj::parse::Sequence_<kj::parse::CharGroup_,_kj::parse::Many_<const_kj::parse::CharGroup__&,_false>_>,_kj::parse::_::ParseInteger<10U>_>_>,_kj::parse::NotLookingAt_<kj::parse::CharGroup_>_>_&,_kj::parse::ExactlyConst_<char,_']'>_>,_false>,_kj::parse::OneOf_<const_kj::parse::EndOfInput__&,_kj::parse::Sequence_<kj::parse::ExactlyConst_<char,_'.'>,_kj::parse::NotLookingAt_<const_kj::parse::EndOfInput__&>_>_>_>
    ::parseNext<kj::parse::IteratorInput<char,_const_char_*>_>
              ((Maybe<kj::_::Tuple<kj::String,_kj::Array<unsigned_long>_>_> *)&local_68,subParser,
               &local_f0);
    kj::_::NullableValue<kj::_::Tuple<kj::String,_kj::Array<unsigned_long>_>_>::NullableValue
              (&local_c8,&local_68);
    kj::_::NullableValue<kj::_::Tuple<kj::String,_kj::Array<unsigned_long>_>_>::~NullableValue
              (&local_68);
    if (local_c8.isSet != true) {
      kj::_::NullableValue<kj::_::Tuple<kj::String,_kj::Array<unsigned_long>_>_>::~NullableValue
                (&local_c8);
      IteratorInput<char,_const_char_*>::~IteratorInput(&local_f0);
      goto LAB_0012489f;
    }
    (local_f0.parent)->pos = local_f0.pos;
    Vector<kj::_::Tuple<kj::String,kj::Array<unsigned_long>>>::
    add<kj::_::Tuple<kj::String,kj::Array<unsigned_long>>>
              ((Vector<kj::_::Tuple<kj::String,kj::Array<unsigned_long>>> *)&local_88,
               &local_c8.field_1.value);
    kj::_::NullableValue<kj::_::Tuple<kj::String,_kj::Array<unsigned_long>_>_>::~NullableValue
              (&local_c8);
    IteratorInput<char,_const_char_*>::~IteratorInput(&local_f0);
  } while( true );
}

Assistant:

static Maybe<Array<Output>> apply(const SubParser& subParser, Input& input) {
    typedef Vector<OutputType<SubParser, Input>> Results;
    Results results;

    while (!input.atEnd()) {
      Input subInput(input);

      KJ_IF_SOME(subResult, subParser(subInput)) {
        subInput.advanceParent();
        results.add(kj::mv(subResult));
      } else {
        break;
      }
    }